

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::DynamicMapField::AllocateMapValue
          (DynamicMapField *this,MapValueRef *map_val)

{
  int iVar1;
  undefined4 extraout_var;
  FieldDescriptor *field;
  Message *pMVar2;
  undefined4 extraout_var_00;
  undefined8 *puVar3;
  Reflection *this_00;
  type_info *ptVar4;
  Arena *pAVar5;
  _func_void_FieldDescriptor_ptr *local_38;
  FieldDescriptor *local_30;
  
  iVar1 = (*(this->default_entry_->super_MessageLite)._vptr_MessageLite[0x13])();
  field = Descriptor::map_value((Descriptor *)CONCAT44(extraout_var,iVar1));
  if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
    local_38 = FieldDescriptor::TypeOnceInit;
    local_30 = field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x30),&local_38,&local_30);
  }
  map_val->type_ = *(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x38) * 4)
  ;
  if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
    local_38 = FieldDescriptor::TypeOnceInit;
    local_30 = field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x30),&local_38,&local_30);
  }
  switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x38) * 4)) {
  case 1:
  case 8:
    pAVar5 = (this->
             super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>)
             .super_MapFieldBase.arena_;
    if (pAVar5 == (Arena *)0x0) goto LAB_002e3a1b;
    if (pAVar5->hooks_cookie_ != (void *)0x0) {
      ptVar4 = (type_info *)&int::typeinfo;
LAB_002e3acc:
      Arena::OnArenaAllocation(pAVar5,ptVar4,8);
    }
LAB_002e3a0c:
    puVar3 = (undefined8 *)Arena::AllocateAlignedNoHook(pAVar5,8);
    goto LAB_002e3a25;
  case 2:
    pAVar5 = (this->
             super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>)
             .super_MapFieldBase.arena_;
    if (pAVar5 == (Arena *)0x0) goto LAB_002e39e5;
    if (pAVar5->hooks_cookie_ != (void *)0x0) {
      ptVar4 = (type_info *)&long::typeinfo;
LAB_002e3ab3:
      Arena::OnArenaAllocation(pAVar5,ptVar4,8);
    }
LAB_002e39d6:
    puVar3 = (undefined8 *)Arena::AllocateAlignedNoHook(pAVar5,8);
    goto LAB_002e39ef;
  case 3:
    pAVar5 = (this->
             super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>)
             .super_MapFieldBase.arena_;
    if (pAVar5 != (Arena *)0x0) {
      if (pAVar5->hooks_cookie_ != (void *)0x0) {
        ptVar4 = (type_info *)&unsigned_int::typeinfo;
        goto LAB_002e3acc;
      }
      goto LAB_002e3a0c;
    }
    goto LAB_002e3a1b;
  case 4:
    pAVar5 = (this->
             super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>)
             .super_MapFieldBase.arena_;
    if (pAVar5 != (Arena *)0x0) {
      if (pAVar5->hooks_cookie_ != (void *)0x0) {
        ptVar4 = (type_info *)&unsigned_long::typeinfo;
        goto LAB_002e3ab3;
      }
      goto LAB_002e39d6;
    }
    goto LAB_002e39e5;
  case 5:
    pAVar5 = (this->
             super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>)
             .super_MapFieldBase.arena_;
    if (pAVar5 != (Arena *)0x0) {
      if (pAVar5->hooks_cookie_ != (void *)0x0) {
        ptVar4 = (type_info *)&double::typeinfo;
        goto LAB_002e3ab3;
      }
      goto LAB_002e39d6;
    }
LAB_002e39e5:
    puVar3 = (undefined8 *)operator_new(8);
LAB_002e39ef:
    *puVar3 = 0;
    break;
  case 6:
    pAVar5 = (this->
             super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>)
             .super_MapFieldBase.arena_;
    if (pAVar5 != (Arena *)0x0) {
      if (pAVar5->hooks_cookie_ != (void *)0x0) {
        ptVar4 = (type_info *)&float::typeinfo;
        goto LAB_002e3acc;
      }
      goto LAB_002e3a0c;
    }
LAB_002e3a1b:
    puVar3 = (undefined8 *)operator_new(4);
LAB_002e3a25:
    *(undefined4 *)puVar3 = 0;
    break;
  case 7:
    pAVar5 = (this->
             super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>)
             .super_MapFieldBase.arena_;
    if (pAVar5 == (Arena *)0x0) {
      puVar3 = (undefined8 *)operator_new(1);
    }
    else {
      if (pAVar5->hooks_cookie_ != (void *)0x0) {
        Arena::OnArenaAllocation(pAVar5,(type_info *)&bool::typeinfo,8);
      }
      puVar3 = (undefined8 *)Arena::AllocateAlignedNoHook(pAVar5,8);
    }
    *(undefined1 *)puVar3 = 0;
    break;
  case 9:
    pAVar5 = (this->
             super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>)
             .super_MapFieldBase.arena_;
    if (pAVar5 == (Arena *)0x0) {
      puVar3 = (undefined8 *)operator_new(0x20);
    }
    else {
      if (pAVar5->hooks_cookie_ != (void *)0x0) {
        Arena::OnArenaAllocation(pAVar5,(type_info *)&std::__cxx11::string::typeinfo,0x20);
      }
      puVar3 = (undefined8 *)
               ArenaImpl::AllocateAlignedAndAddCleanup
                         (&pAVar5->impl_,0x20,arena_destruct_object<std::__cxx11::string>);
    }
    *puVar3 = puVar3 + 2;
    puVar3[1] = 0;
    *(undefined1 *)(puVar3 + 2) = 0;
    break;
  case 10:
    (*(this->default_entry_->super_MessageLite)._vptr_MessageLite[0x13])();
    pMVar2 = Reflection::GetMessage(this_00,this->default_entry_,field,(MessageFactory *)0x0);
    iVar1 = (*(pMVar2->super_MessageLite)._vptr_MessageLite[4])
                      (pMVar2,(this->
                              super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
                              ).super_MapFieldBase.arena_);
    puVar3 = (undefined8 *)CONCAT44(extraout_var_00,iVar1);
    break;
  default:
    goto switchD_002e38da_default;
  }
  map_val->data_ = puVar3;
switchD_002e38da_default:
  return;
}

Assistant:

void DynamicMapField::AllocateMapValue(MapValueRef* map_val) {
  const FieldDescriptor* val_des = default_entry_->GetDescriptor()->map_value();
  map_val->SetType(val_des->cpp_type());
  // Allocate memory for the MapValueRef, and initialize to
  // default value.
  switch (val_des->cpp_type()) {
#define HANDLE_TYPE(CPPTYPE, TYPE)                           \
  case FieldDescriptor::CPPTYPE_##CPPTYPE: {                 \
    TYPE* value = Arena::Create<TYPE>(MapFieldBase::arena_); \
    map_val->SetValue(value);                                \
    break;                                                   \
  }
    HANDLE_TYPE(INT32, int32);
    HANDLE_TYPE(INT64, int64);
    HANDLE_TYPE(UINT32, uint32);
    HANDLE_TYPE(UINT64, uint64);
    HANDLE_TYPE(DOUBLE, double);
    HANDLE_TYPE(FLOAT, float);
    HANDLE_TYPE(BOOL, bool);
    HANDLE_TYPE(STRING, std::string);
    HANDLE_TYPE(ENUM, int32);
#undef HANDLE_TYPE
    case FieldDescriptor::CPPTYPE_MESSAGE: {
      const Message& message =
          default_entry_->GetReflection()->GetMessage(*default_entry_, val_des);
      Message* value = message.New(MapFieldBase::arena_);
      map_val->SetValue(value);
      break;
    }
  }
}